

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O2

int Gia_ObjUnrReadCopy0(Gia_ManUnr_t *p,Gia_Obj_t *pObj,int Id)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = *(uint *)pObj;
  iVar2 = Vec_IntEntry(p->vDegDiff,Id * 2);
  iVar2 = Gia_ObjUnrRead(p,Id - (uVar1 & 0x1fffffff),iVar2);
  iVar2 = Abc_LitNotCond(iVar2,*(uint *)pObj >> 0x1d & 1);
  return iVar2;
}

Assistant:

static inline int Gia_ObjUnrReadCopy0( Gia_ManUnr_t * p, Gia_Obj_t * pObj, int Id )  
{
    int Lit = Gia_ObjUnrRead(p, Gia_ObjFaninId0(pObj, Id), Vec_IntEntry(p->vDegDiff, 2*Id));
    return Abc_LitNotCond( Lit, Gia_ObjFaninC0(pObj) );
}